

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

bool __thiscall
SQCompilation::FunctionReturnTypeEvaluator::checkNode
          (FunctionReturnTypeEvaluator *this,Statement *n)

{
  TreeOp TVar1;
  ReturnStatement *ret;
  TryStatement *in_RSI;
  LoopStatement *in_RDI;
  FunctionReturnTypeEvaluator *unaff_retaddr;
  Block *in_stack_00000008;
  FunctionReturnTypeEvaluator *in_stack_00000020;
  LoopStatement *this_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar2;
  
  this_00 = in_RDI;
  TVar1 = Node::op((Node *)in_RSI);
  ret = (ReturnStatement *)(ulong)TVar1;
  switch(ret) {
  case (ReturnStatement *)0x0:
    bVar2 = checkBlock((FunctionReturnTypeEvaluator *)n,in_stack_00000008);
    break;
  case (ReturnStatement *)0x1:
    bVar2 = checkIf(unaff_retaddr,
                    (IfStatement *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    break;
  case (ReturnStatement *)0x2:
  case (ReturnStatement *)0x3:
  case (ReturnStatement *)0x4:
  case (ReturnStatement *)0x5:
    bVar2 = checkLoop((FunctionReturnTypeEvaluator *)ret,in_RDI);
    break;
  case (ReturnStatement *)0x6:
    bVar2 = checkSwitch(in_stack_00000020,(SwitchStatement *)this);
    break;
  case (ReturnStatement *)0x7:
    bVar2 = checkReturn((FunctionReturnTypeEvaluator *)in_RSI,ret);
    break;
  default:
    bVar2 = false;
    break;
  case (ReturnStatement *)0x9:
    bVar2 = checkThrow((FunctionReturnTypeEvaluator *)in_RDI,(ThrowStatement *)in_RSI);
    break;
  case (ReturnStatement *)0xa:
    bVar2 = checkTry((FunctionReturnTypeEvaluator *)this_00,in_RSI);
  }
  return bVar2;
}

Assistant:

bool FunctionReturnTypeEvaluator::checkNode(const Statement *n) {
  switch (n->op())
  {
  case TO_RETURN: return checkReturn(static_cast<const ReturnStatement *>(n));
  case TO_THROW: return checkThrow(static_cast<const ThrowStatement *>(n));
  case TO_FOR: case TO_FOREACH: case TO_WHILE: case TO_DOWHILE:
    return checkLoop(static_cast<const LoopStatement *>(n));
  case TO_IF: return checkIf(static_cast<const IfStatement *>(n));
  case TO_SWITCH: return checkSwitch(static_cast<const SwitchStatement *>(n));
  case TO_BLOCK: return checkBlock(static_cast<const Block *>(n));
  case TO_TRY: return checkTry(static_cast<const TryStatement *>(n));
  default:
    return false;
  }
}